

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  byte *pbVar8;
  int iVar9;
  undefined7 in_register_00000009;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  byte *pbVar13;
  uint uVar14;
  byte *pbVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  
  uVar14 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar14 == 1) {
    lVar17 = 1;
    bVar16 = false;
    pbVar10 = (byte *)zNum;
  }
  else {
    uVar12 = length & 0xfffffffe;
    uVar6 = 3 - uVar14;
    uVar11 = (ulong)uVar6;
    bVar16 = (int)uVar6 < (int)uVar12;
    if (((int)uVar6 < (int)uVar12) &&
       (uVar11 = 3 - (CONCAT71(in_register_00000009,enc) & 0xffffffff), zNum[uVar11] == '\0')) {
      uVar11 = 5 - (ulong)enc;
      do {
        bVar16 = (long)uVar11 < (long)(int)uVar12;
        if ((long)(int)uVar12 <= (long)uVar11) goto LAB_00155c90;
        uVar1 = uVar11 + 2;
        pcVar2 = zNum + uVar11;
        uVar11 = uVar1;
      } while (*pcVar2 == '\0');
      uVar11 = (ulong)((int)uVar1 - 2);
    }
LAB_00155c90:
    length = (uint)uVar11 ^ 1;
    pbVar10 = (byte *)(zNum + (uVar14 & 1));
    lVar17 = 2;
  }
  pbVar15 = (byte *)(zNum + length);
  bVar5 = true;
  for (; pbVar8 = pbVar10, pbVar10 < pbVar15; pbVar10 = pbVar10 + lVar17) {
    bVar3 = *pbVar10;
    if ((""[bVar3] & 1) == 0) {
      if (bVar3 == 0x2b) {
        pbVar10 = pbVar10 + lVar17;
        pbVar8 = pbVar10;
      }
      else if (bVar3 == 0x2d) {
        pbVar10 = pbVar10 + lVar17;
        bVar5 = false;
        pbVar8 = pbVar10;
      }
      break;
    }
  }
  for (; (pbVar10 < pbVar15 && (*pbVar10 == 0x30)); pbVar10 = pbVar10 + lVar17) {
  }
  bVar21 = pbVar15 <= pbVar10;
  if ((bVar21) || (bVar3 = *pbVar10, 9 < (byte)(bVar3 - 0x30))) {
    lVar7 = 0;
    uVar14 = 0;
  }
  else {
    lVar7 = 0;
    uVar14 = 0;
    pbVar13 = pbVar10;
    do {
      pbVar13 = pbVar13 + lVar17;
      lVar7 = (ulong)bVar3 + lVar7 * 10 + -0x30;
      uVar14 = uVar14 + (int)lVar17;
      bVar21 = pbVar15 <= pbVar13;
      if (bVar21) break;
      bVar3 = *pbVar13;
    } while ((byte)(bVar3 - 0x30) < 10);
  }
  lVar20 = -0x8000000000000000;
  lVar18 = -lVar7;
  lVar19 = lVar20;
  if (bVar5) {
    lVar19 = 0x7fffffffffffffff;
    lVar18 = lVar7;
  }
  if (lVar7 < 0) {
    lVar18 = lVar19;
  }
  *pNum = lVar18;
  if ((uVar14 != 0) || (uVar6 = 0xffffffff, pbVar8 != pbVar10)) {
    if (bVar21 || bVar16 != false) {
      uVar6 = (uint)bVar16;
    }
    else {
      pbVar8 = pbVar10 + uVar14;
      do {
        if ((""[*pbVar8] & 1) == 0) {
          uVar6 = 1;
          goto LAB_00155db6;
        }
        pbVar8 = pbVar8 + lVar17;
      } while (pbVar8 < pbVar15);
      uVar6 = 0;
    }
  }
LAB_00155db6:
  uVar12 = (int)lVar17 * 0x13;
  if (uVar12 <= uVar14) {
    iVar9 = 1;
    if (uVar14 <= uVar12) {
      uVar11 = 0;
      pbVar15 = pbVar10;
      do {
        bVar3 = *pbVar15;
        bVar4 = "922337203685477580"[uVar11];
        if (0x10 < uVar11) break;
        uVar11 = uVar11 + 1;
        pbVar15 = pbVar15 + lVar17;
      } while (bVar3 == bVar4);
      if (bVar3 == bVar4) {
        iVar9 = (char)pbVar10[lVar17 * 0x12] + -0x38;
      }
      else {
        iVar9 = ((int)(char)bVar3 - (int)(char)bVar4) * 10;
      }
    }
    if (-1 < iVar9) {
      if (bVar5) {
        lVar20 = 0x7fffffffffffffff;
      }
      *pNum = lVar20;
      if (bVar5) {
        uVar6 = 3;
      }
      if (iVar9 != 0) {
        uVar6 = 2;
      }
    }
  }
  return uVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appaise the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( i==0 && zStart==zNum ){    /* No digits */
    rc = -1;
  }else if( nonNum ){            /* UTF16 with high-order bytes non-zero */
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}